

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.h
# Opt level: O3

void idx2::WriteStream(bitstream *Bs,bitstream *Src)

{
  int iVar1;
  uint uVar2;
  u64 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  int iVar6;
  buffer Dst;
  buffer local_48;
  buffer local_30;
  
  puVar3 = (u64 *)Bs->BitPtr;
  *puVar3 = Bs->BitBuf;
  Bs->BitPtr = (byte *)((long)(int)(((Bs->BitPos >> 3) + 1) - (uint)((Bs->BitPos & 7U) == 0)) +
                       (long)puVar3);
  Bs->BitPos = 0;
  Bs->BitBuf = 0;
  puVar4 = (ulong *)Src->BitPtr;
  uVar5 = Src->BitBuf;
  *puVar4 = uVar5;
  uVar2 = Src->BitPos;
  if (0 < (int)uVar2 >> 3) {
    Src->BitBuf = (uVar5 >> 1) >> (((byte)uVar2 & 0xf8) - 1 & 0x3f);
  }
  Src->BitPtr = (byte *)((long)puVar4 + (long)((int)uVar2 >> 3));
  Src->BitPos = uVar2 & 7;
  iVar1 = Bs->BitPos + 7;
  iVar6 = Bs->BitPos + 0xe;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  operator+(&local_30,&Bs->Stream,(i64)(Bs->BitPtr + ((long)(iVar6 >> 3) - (long)(Bs->Stream).Data))
           );
  local_48.Data = (Src->Stream).Data;
  iVar1 = Src->BitPos + 7;
  iVar6 = Src->BitPos + 0xe;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  local_48.Alloc = (Src->Stream).Alloc;
  local_48.Bytes = (i64)(Src->BitPtr + ((long)(iVar6 >> 3) - (long)local_48.Data));
  MemCopy(&local_48,&local_30);
  iVar1 = Src->BitPos + 7;
  iVar6 = Src->BitPos + 0xe;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  Bs->BitPtr = Bs->BitPtr + (long)(Src->BitPtr + ((long)(iVar6 >> 3) - (long)(Src->Stream).Data));
  return;
}

Assistant:

inline void
WriteStream(bitstream* Bs, bitstream* Src)
{
  FlushAndMoveToNextByte(Bs);
  Flush(Src);
  buffer Dst = Bs->Stream + Size(*Bs);
  MemCopy(ToBuffer(*Src), &Dst);
  Bs->BitPtr += Size(*Src);
}